

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

Vec_Ptr_t * Ver_ParseCollectUndefBoxes(Ver_Man_t *pMan)

{
  Abc_Ntk_t *pNtkBox;
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *Entry;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int i;
  
  for (iVar5 = 0; pVVar3 = pMan->pDesign->vModules, iVar5 < pVVar3->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pVVar3,iVar5);
    *(undefined8 *)((long)pvVar2 + 0x158) = 0;
  }
  pVVar3 = Vec_PtrAlloc(0x10);
  for (iVar5 = 0; pVVar4 = pMan->pDesign->vModules, iVar5 < pVVar4->nSize; iVar5 = iVar5 + 1) {
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry(pVVar4,iVar5);
    for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
      Entry = Abc_NtkBox(pNtk,i);
      if (((*(uint *)&Entry->field_0x14 & 0xf) == 10) &&
         (pNtkBox = (Abc_Ntk_t *)(Entry->field_5).pData, pNtkBox != (Abc_Ntk_t *)0x0)) {
        iVar1 = Ver_NtkIsDefined(pNtkBox);
        if (iVar1 == 0) {
          pVVar4 = (Vec_Ptr_t *)pNtkBox->pData;
          if (pVVar4 == (Vec_Ptr_t *)0x0) {
            Vec_PtrPush(pVVar3,pNtkBox);
            pVVar4 = Vec_PtrAlloc(0x10);
            pNtkBox->pData = pVVar4;
          }
          Vec_PtrPush(pVVar4,Entry);
        }
      }
    }
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Ver_ParseCollectUndefBoxes( Ver_Man_t * pMan )
{
    Vec_Ptr_t * vUndefs;
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    int i, k;
    // clear the module structures
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->pData = NULL;
    // go through all the blackboxes
    vUndefs = Vec_PtrAlloc( 16 );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
        {
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            if ( Ver_NtkIsDefined(pNtkBox) )
                continue;
            if ( pNtkBox->pData == NULL )
            {
                // save the box
                Vec_PtrPush( vUndefs, pNtkBox );
                pNtkBox->pData = Vec_PtrAlloc( 16 );
            }
            // save the instance
            Vec_PtrPush( (Vec_Ptr_t *)pNtkBox->pData, pBox );
        }
    }
    return vUndefs;
}